

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe60At4(uint8_t *buf)

{
  return (ulong)(*buf >> 4) |
         (ulong)((uint)buf[1] << 4 | (uint)buf[2] << 0xc) |
         ((ulong)buf[3] |
         (ulong)buf[4] << 8 | (ulong)buf[5] << 0x10 | (ulong)*(ushort *)(buf + 6) << 0x18) << 0x14;
}

Assistant:

std::uint64_t readFlUIntLe60At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 4;
    res |= (buf[0] >> 4);
    res &= UINT64_C(0xfffffffffffffff);
    return res;
}